

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::LineStripRenderer<ImPlot::GetterYs<unsigned_char>,_ImPlot::TransformerLinLog>::operator()
          (LineStripRenderer<ImPlot::GetterYs<unsigned_char>,_ImPlot::TransformerLinLog> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  ImVec2 IVar5;
  int iVar6;
  ImU32 IVar7;
  GetterYs<unsigned_char> *pGVar8;
  TransformerLinLog *pTVar9;
  ImPlotPlot *pIVar10;
  ImDrawVert *pIVar11;
  uint *puVar12;
  ImPlotContext *pIVar13;
  bool bVar14;
  float fVar15;
  double dVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  
  pIVar13 = GImPlot;
  pGVar8 = this->Getter;
  dVar2 = pGVar8->XScale;
  dVar3 = pGVar8->X0;
  pTVar9 = this->Transformer;
  iVar6 = pGVar8->Count;
  dVar16 = log10((double)pGVar8->Ys
                         [(long)(((prim + 1 + pGVar8->Offset) % iVar6 + iVar6) % iVar6) *
                          (long)pGVar8->Stride] /
                 GImPlot->CurrentPlot->YAxis[pTVar9->YAxis].Range.Min);
  iVar6 = pTVar9->YAxis;
  pIVar10 = pIVar13->CurrentPlot;
  dVar4 = pIVar10->YAxis[iVar6].Range.Min;
  fVar19 = (float)((((double)(prim + 1) * dVar2 + dVar3) - (pIVar10->XAxis).Range.Min) * pIVar13->Mx
                  + (double)pIVar13->PixelRange[iVar6].Min.x);
  fVar20 = (float)((((double)(float)(dVar16 / pIVar13->LogDenY[iVar6]) *
                     (pIVar10->YAxis[iVar6].Range.Max - dVar4) + dVar4) - dVar4) *
                   pIVar13->My[iVar6] + (double)pIVar13->PixelRange[iVar6].Min.y);
  fVar18 = (this->P1).x;
  fVar21 = (this->P1).y;
  fVar17 = fVar21;
  if (fVar20 <= fVar21) {
    fVar17 = fVar20;
  }
  bVar14 = false;
  if ((fVar17 < (cull_rect->Max).y) &&
     (fVar17 = (float)(-(uint)(fVar20 <= fVar21) & (uint)fVar21 |
                      ~-(uint)(fVar20 <= fVar21) & (uint)fVar20), pfVar1 = &(cull_rect->Min).y,
     bVar14 = false, *pfVar1 <= fVar17 && fVar17 != *pfVar1)) {
    fVar17 = fVar18;
    if (fVar19 <= fVar18) {
      fVar17 = fVar19;
    }
    if (fVar17 < (cull_rect->Max).x) {
      fVar17 = (float)(~-(uint)(fVar19 <= fVar18) & (uint)fVar19 |
                      -(uint)(fVar19 <= fVar18) & (uint)fVar18);
      bVar14 = (cull_rect->Min).x <= fVar17 && fVar17 != (cull_rect->Min).x;
    }
  }
  if (bVar14 != false) {
    fVar17 = this->Weight;
    IVar7 = this->Col;
    IVar5 = *uv;
    fVar18 = fVar19 - fVar18;
    fVar21 = fVar20 - fVar21;
    fVar15 = fVar18 * fVar18 + fVar21 * fVar21;
    if (0.0 < fVar15) {
      if (fVar15 < 0.0) {
        fVar15 = sqrtf(fVar15);
      }
      else {
        fVar15 = SQRT(fVar15);
      }
      fVar18 = fVar18 * (1.0 / fVar15);
      fVar21 = fVar21 * (1.0 / fVar15);
    }
    fVar17 = fVar17 * 0.5;
    fVar18 = fVar18 * fVar17;
    fVar17 = fVar17 * fVar21;
    pIVar11 = DrawList->_VtxWritePtr;
    (pIVar11->pos).x = (this->P1).x + fVar17;
    (pIVar11->pos).y = (this->P1).y - fVar18;
    pIVar11->uv = IVar5;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11->col = IVar7;
    pIVar11[1].pos.x = fVar17 + fVar19;
    pIVar11[1].pos.y = fVar20 - fVar18;
    pIVar11[1].uv = IVar5;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[1].col = IVar7;
    pIVar11[2].pos.x = fVar19 - fVar17;
    pIVar11[2].pos.y = fVar18 + fVar20;
    pIVar11[2].uv = IVar5;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[2].col = IVar7;
    pIVar11[3].pos.x = (this->P1).x - fVar17;
    pIVar11[3].pos.y = fVar18 + (this->P1).y;
    pIVar11[3].uv = IVar5;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[3].col = IVar7;
    DrawList->_VtxWritePtr = pIVar11 + 4;
    puVar12 = DrawList->_IdxWritePtr;
    *puVar12 = DrawList->_VtxCurrentIdx;
    puVar12[1] = DrawList->_VtxCurrentIdx + 1;
    puVar12[2] = DrawList->_VtxCurrentIdx + 2;
    puVar12[3] = DrawList->_VtxCurrentIdx;
    puVar12[4] = DrawList->_VtxCurrentIdx + 2;
    puVar12[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar12 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
  }
  IVar5.y = fVar20;
  IVar5.x = fVar19;
  this->P1 = IVar5;
  return bVar14;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        P1 = P2;
        return true;
    }